

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::report_query(ConsoleReporter *this,QueryData *in)

{
  ostream *poVar1;
  long in_RSI;
  ConsoleReporter *in_RDI;
  uint i_1;
  uint i;
  ConsoleReporter *in_stack_000001e0;
  Enum in_stack_ffffffffffffffdc;
  uint local_18;
  uint local_14;
  
  if ((in_RDI->opt->version & 1U) == 0) {
    if ((in_RDI->opt->help & 1U) == 0) {
      if ((in_RDI->opt->list_reporters & 1U) == 0) {
        if (((in_RDI->opt->count & 1U) == 0) && ((in_RDI->opt->list_test_cases & 1U) == 0)) {
          if ((in_RDI->opt->list_test_suites & 1U) != 0) {
            poVar1 = Color::operator<<((ostream *)in_RDI,in_stack_ffffffffffffffdc);
            std::operator<<(poVar1,"[doctest] ");
            poVar1 = Color::operator<<((ostream *)in_RDI,in_stack_ffffffffffffffdc);
            std::operator<<(poVar1,"listing all test suites\n");
            separator_to_stream((ConsoleReporter *)0x12c28d);
            for (local_18 = 0; local_18 < *(uint *)(in_RSI + 0x10); local_18 = local_18 + 1) {
              poVar1 = Color::operator<<((ostream *)in_RDI,in_stack_ffffffffffffffdc);
              poVar1 = std::operator<<(poVar1,*(char **)(*(long *)(*(long *)(in_RSI + 8) +
                                                                  (ulong)local_18 * 8) + 0x28));
              std::operator<<(poVar1,"\n");
            }
            separator_to_stream((ConsoleReporter *)0x12c2f6);
            poVar1 = Color::operator<<((ostream *)in_RDI,in_stack_ffffffffffffffdc);
            std::operator<<(poVar1,"[doctest] ");
            poVar1 = Color::operator<<((ostream *)in_RDI,in_stack_ffffffffffffffdc);
            poVar1 = std::operator<<(poVar1,"unskipped test cases passing the current filters: ");
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(detail::g_cs + 0x8c));
            std::operator<<(poVar1,"\n");
            poVar1 = Color::operator<<((ostream *)in_RDI,in_stack_ffffffffffffffdc);
            std::operator<<(poVar1,"[doctest] ");
            poVar1 = Color::operator<<((ostream *)in_RDI,in_stack_ffffffffffffffdc);
            poVar1 = std::operator<<(poVar1,
                                     "test suites with unskipped test cases passing the current filters: "
                                    );
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(detail::g_cs + 0x90));
            std::operator<<(poVar1,"\n");
          }
        }
        else {
          if ((in_RDI->opt->list_test_cases & 1U) != 0) {
            poVar1 = Color::operator<<((ostream *)in_RDI,in_stack_ffffffffffffffdc);
            std::operator<<(poVar1,"[doctest] ");
            poVar1 = Color::operator<<((ostream *)in_RDI,in_stack_ffffffffffffffdc);
            std::operator<<(poVar1,"listing all test case names\n");
            separator_to_stream((ConsoleReporter *)0x12c165);
          }
          for (local_14 = 0; local_14 < *(uint *)(in_RSI + 0x10); local_14 = local_14 + 1) {
            poVar1 = Color::operator<<((ostream *)in_RDI,in_stack_ffffffffffffffdc);
            poVar1 = std::operator<<(poVar1,*(char **)(*(long *)(*(long *)(in_RSI + 8) +
                                                                (ulong)local_14 * 8) + 0x20));
            std::operator<<(poVar1,"\n");
          }
          separator_to_stream((ConsoleReporter *)0x12c1ce);
          poVar1 = Color::operator<<((ostream *)in_RDI,in_stack_ffffffffffffffdc);
          std::operator<<(poVar1,"[doctest] ");
          poVar1 = Color::operator<<((ostream *)in_RDI,in_stack_ffffffffffffffdc);
          poVar1 = std::operator<<(poVar1,"unskipped test cases passing the current filters: ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(detail::g_cs + 0x8c));
          std::operator<<(poVar1,"\n");
        }
      }
      else {
        printRegisteredReporters(in_RDI);
      }
    }
    else {
      printHelp(in_stack_000001e0);
    }
  }
  else {
    printVersion(in_RDI);
  }
  return;
}

Assistant:

void report_query(const QueryData& in) override {
            if(opt.version) {
                printVersion();
            } else if(opt.help) {
                printHelp();
            } else if(opt.list_reporters) {
                printRegisteredReporters();
            } else if(opt.count || opt.list_test_cases) {
                if(opt.list_test_cases) {
                    s << Color::Cyan << "[doctest] " << Color::None
                      << "listing all test case names\n";
                    separator_to_stream();
                }

                for(unsigned i = 0; i < in.num_data; ++i)
                    s << Color::None << in.data[i]->m_name << "\n";

                separator_to_stream();

                s << Color::Cyan << "[doctest] " << Color::None
                  << "unskipped test cases passing the current filters: "
                  << g_cs->numTestCasesPassingFilters << "\n";

            } else if(opt.list_test_suites) {
                s << Color::Cyan << "[doctest] " << Color::None << "listing all test suites\n";
                separator_to_stream();

                for(unsigned i = 0; i < in.num_data; ++i)
                    s << Color::None << in.data[i]->m_test_suite << "\n";

                separator_to_stream();

                s << Color::Cyan << "[doctest] " << Color::None
                  << "unskipped test cases passing the current filters: "
                  << g_cs->numTestCasesPassingFilters << "\n";
                s << Color::Cyan << "[doctest] " << Color::None
                  << "test suites with unskipped test cases passing the current filters: "
                  << g_cs->numTestSuitesPassingFilters << "\n";
            }
        }